

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Flatten_x86_avx::forward(Flatten_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  long lVar26;
  undefined1 (*pauVar27) [32];
  int iVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  undefined1 (*pauVar42) [32];
  int iVar43;
  long lVar44;
  long lVar45;
  size_t sVar46;
  uint uVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [16];
  undefined1 (*pauVar53) [16];
  undefined4 *puVar54;
  undefined4 *puVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  long local_78;
  long local_70;
  long local_68;
  long local_58;
  
  iVar25 = bottom_blob->elempack;
  if (((long)iVar25 != 0) && (((int)bottom_blob->elemsize << 3) / iVar25 == 8)) {
    iVar25 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar25;
  }
  iVar39 = bottom_blob->dims;
  if (iVar39 == 1) {
    iVar43 = 0;
    if (top_blob != bottom_blob) {
      piVar7 = bottom_blob->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      piVar7 = top_blob->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar7 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar7;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar25 = bottom_blob->w;
      iVar39 = bottom_blob->h;
      iVar6 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar25;
      top_blob->h = iVar39;
      top_blob->d = iVar6;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    uVar29 = bottom_blob->w;
    lVar32 = (long)(int)uVar29;
    uVar38 = bottom_blob->h;
    uVar5 = bottom_blob->c;
    uVar40 = (ulong)uVar5;
    uVar47 = uVar38 * uVar29 * bottom_blob->d;
    uVar48 = uVar5 * iVar25 * uVar47;
    uVar35 = 1;
    if (opt->use_packing_layout == true) {
      uVar35 = 8;
      if ((uVar48 & 7) != 0) {
        uVar35 = (uint)((uVar48 & 3) == 0) * 3 + 1;
      }
    }
    if (uVar35 == 1) {
      iVar25 = Flatten::forward(&this->super_Flatten,bottom_blob,top_blob,opt);
      return iVar25;
    }
    sVar46 = (bottom_blob->elemsize / (ulong)(long)iVar25) * (ulong)uVar35;
    if (iVar25 == 1 && iVar39 == 2) {
      if (top_blob != bottom_blob) {
        piVar7 = bottom_blob->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
        piVar7 = top_blob->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar7 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar7;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar25 = bottom_blob->w;
        iVar39 = bottom_blob->h;
        iVar43 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar25;
        top_blob->h = iVar39;
        top_blob->d = iVar43;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
      top_blob->dims = 1;
      top_blob->w = (int)uVar48 / (int)uVar35;
      top_blob->h = 1;
      top_blob->cstep = (long)((int)uVar48 / (int)uVar35);
      top_blob->elemsize = sVar46;
      top_blob->elempack = uVar35;
      iVar43 = 0;
    }
    else {
      Mat::create(top_blob,(int)uVar48 / (int)uVar35,sVar46,uVar35,opt->blob_allocator);
      iVar43 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (iVar39 == 2) {
          if (iVar25 == 4) {
            if (0 < (int)uVar38) {
              uVar51 = 1;
              if (1 < (int)uVar38) {
                uVar51 = (ulong)uVar38;
              }
              lVar33 = lVar32 * 4;
              lVar36 = lVar32 * 0xc;
              lVar45 = lVar32 * 0x10;
              lVar44 = lVar32 * 8;
              iVar43 = 0;
              uVar34 = 0;
              do {
                iVar6 = bottom_blob->w;
                pvVar8 = bottom_blob->data;
                sVar46 = bottom_blob->elemsize;
                pauVar52 = (undefined1 (*) [16])(uVar34 * (long)iVar6 * sVar46 + (long)pvVar8);
                pvVar9 = top_blob->data;
                if ((int)uVar29 < 4) {
                  lVar26 = (long)(int)(uVar29 * 4 * (int)uVar34) * 4;
                  lVar30 = (uVar34 * 4 + 1) * lVar32 * 4;
                  lVar37 = (uVar34 * 4 + 2) * lVar32 * 4;
                  lVar4 = (uVar34 * 4 + 3) * lVar32 * 4;
                  uVar38 = 0;
                }
                else {
                  iVar28 = 3;
                  lVar30 = 0;
                  do {
                    pauVar53 = pauVar52;
                    pauVar52 = (undefined1 (*) [16])
                               ((long)pvVar8 + lVar30 * 4 + sVar46 * uVar34 * (long)iVar6);
                    auVar20 = vunpcklps_avx(*pauVar52,pauVar52[1]);
                    auVar21 = vunpcklps_avx(pauVar52[2],pauVar52[3]);
                    auVar12 = vunpckhps_avx(*pauVar52,pauVar52[1]);
                    auVar13 = vunpckhps_avx(pauVar52[2],pauVar52[3]);
                    auVar11 = vmovlhps_avx(auVar20,auVar21);
                    auVar21 = vunpckhpd_avx(auVar20,auVar21);
                    auVar20 = vmovlhps_avx(auVar12,auVar13);
                    auVar12 = vunpckhpd_avx(auVar12,auVar13);
                    *(undefined1 (*) [16])((long)pvVar9 + lVar30 + (long)iVar43 * 4) = auVar11;
                    *(undefined1 (*) [16])((long)pvVar9 + lVar30 + lVar33) = auVar21;
                    *(undefined1 (*) [16])((long)pvVar9 + lVar30 + lVar44) = auVar20;
                    *(undefined1 (*) [16])((long)pvVar9 + lVar30 + lVar36) = auVar12;
                    lVar30 = lVar30 + 0x10;
                    iVar28 = iVar28 + 4;
                    pauVar52 = pauVar52 + 4;
                  } while (iVar28 < (int)uVar29);
                  pauVar52 = pauVar53 + 4;
                  lVar26 = lVar30 + (long)iVar43 * 4;
                  lVar4 = lVar30 + lVar36;
                  lVar37 = lVar30 + lVar44;
                  lVar30 = lVar30 + lVar33;
                  uVar38 = uVar29 & 0xfffffffc;
                }
                if ((int)uVar38 < (int)uVar29) {
                  lVar41 = 0;
                  do {
                    *(undefined4 *)((long)pvVar9 + lVar41 * 4 + lVar26) = *(undefined4 *)*pauVar52;
                    *(undefined4 *)((long)pvVar9 + lVar41 * 4 + lVar30) =
                         *(undefined4 *)(*pauVar52 + 4);
                    *(undefined4 *)((long)pvVar9 + lVar41 * 4 + lVar37) =
                         *(undefined4 *)(*pauVar52 + 8);
                    *(undefined4 *)((long)pvVar9 + lVar41 * 4 + lVar4) =
                         *(undefined4 *)(*pauVar52 + 0xc);
                    pauVar52 = pauVar52 + 1;
                    lVar41 = lVar41 + 1;
                  } while (uVar29 - uVar38 != (int)lVar41);
                }
                uVar34 = uVar34 + 1;
                iVar43 = iVar43 + uVar29 * 4;
                lVar36 = lVar36 + lVar45;
                lVar44 = lVar44 + lVar45;
                lVar33 = lVar33 + lVar45;
              } while (uVar34 != uVar51);
            }
          }
          else if ((iVar25 == 8) && (0 < (int)uVar38)) {
            lVar33 = lVar32 * 4;
            lVar26 = lVar32 * 0x20;
            lVar44 = lVar32 * 8;
            lVar36 = lVar32 * 0xc;
            local_68 = lVar32 << 4;
            local_70 = lVar32 * 0x14;
            local_78 = lVar32 * 0x18;
            local_58 = lVar32 * 0x1c;
            iVar43 = 0;
            uVar51 = 0;
            lVar45 = lVar33;
            do {
              iVar6 = bottom_blob->w;
              pvVar8 = bottom_blob->data;
              sVar46 = bottom_blob->elemsize;
              pauVar27 = (undefined1 (*) [32])(uVar51 * (long)iVar6 * sVar46 + (long)pvVar8);
              pvVar9 = top_blob->data;
              if ((int)uVar29 < 8) {
                lVar30 = (long)(int)(uVar29 * 8 * (int)uVar51) * 4;
                lVar37 = (uVar51 * 8 + 1) * lVar32 * 4;
                lVar4 = (uVar51 * 8 + 2) * lVar32 * 4;
                lVar41 = (uVar51 * 8 + 3) * lVar32 * 4;
                lVar1 = (uVar51 * 8 + 4) * lVar32 * 4;
                lVar2 = (uVar51 * 8 + 5) * lVar32 * 4;
                lVar3 = (uVar51 * 8 + 6) * lVar32 * 4;
                lVar49 = (uVar51 * 8 + 7) * lVar32 * 4;
                uVar35 = 0;
              }
              else {
                iVar28 = 7;
                lVar49 = 0;
                do {
                  pauVar42 = pauVar27;
                  pauVar27 = (undefined1 (*) [32])
                             ((long)pvVar8 + lVar49 * 8 + sVar46 * uVar51 * (long)iVar6);
                  auVar22 = vunpcklps_avx(*pauVar27,pauVar27[1]);
                  auVar14 = vunpckhps_avx(*pauVar27,pauVar27[1]);
                  auVar23 = vunpcklps_avx(pauVar27[2],pauVar27[3]);
                  auVar15 = vunpckhps_avx(pauVar27[2],pauVar27[3]);
                  auVar24 = vunpcklps_avx(pauVar27[4],pauVar27[5]);
                  auVar16 = vunpckhps_avx(pauVar27[4],pauVar27[5]);
                  auVar56 = vunpcklps_avx(pauVar27[6],pauVar27[7]);
                  auVar17 = vunpckhps_avx(pauVar27[6],pauVar27[7]);
                  auVar18 = vunpcklpd_avx(auVar22,auVar23);
                  auVar22 = vunpckhpd_avx(auVar22,auVar23);
                  auVar23 = vunpcklpd_avx(auVar14,auVar15);
                  auVar14 = vunpckhpd_avx(auVar14,auVar15);
                  auVar19 = vunpcklpd_avx(auVar24,auVar56);
                  auVar15 = vunpckhpd_avx(auVar24,auVar56);
                  auVar24 = vunpcklpd_avx(auVar16,auVar17);
                  auVar16 = vunpckhpd_avx(auVar16,auVar17);
                  auVar56._16_16_ = auVar19._0_16_;
                  auVar56._0_16_ = auVar18._0_16_;
                  auVar58._16_16_ = auVar15._0_16_;
                  auVar58._0_16_ = auVar22._0_16_;
                  auVar60._16_16_ = auVar24._0_16_;
                  auVar60._0_16_ = auVar23._0_16_;
                  auVar62._16_16_ = auVar16._0_16_;
                  auVar62._0_16_ = auVar14._0_16_;
                  auVar17 = vperm2f128_avx(auVar18,auVar19,0x31);
                  auVar22 = vperm2f128_avx(auVar22,auVar15,0x31);
                  auVar15 = vperm2f128_avx(auVar23,auVar24,0x31);
                  auVar14 = vperm2f128_avx(auVar14,auVar16,0x31);
                  *(undefined1 (*) [32])((long)pvVar9 + lVar49 + (long)iVar43 * 4) = auVar56;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar49 + lVar45) = auVar58;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar33 + lVar49 + lVar45) = auVar60;
                  lVar30 = lVar33 + lVar49 + lVar45;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar33 + lVar30) = auVar62;
                  lVar30 = lVar33 + lVar30;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar33 + lVar30) = auVar17;
                  lVar30 = lVar33 + lVar30;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar33 + lVar30) = auVar22;
                  lVar30 = lVar33 + lVar30;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar33 + lVar30) = auVar15;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar32 * 8 + lVar30) = auVar14;
                  lVar49 = lVar49 + 0x20;
                  iVar28 = iVar28 + 8;
                  pauVar27 = pauVar27 + 8;
                } while (iVar28 < (int)uVar29);
                pauVar27 = pauVar42 + 8;
                lVar30 = lVar49 + (long)iVar43 * 4;
                lVar37 = lVar49 + lVar45;
                lVar4 = lVar49 + lVar44;
                lVar41 = lVar49 + lVar36;
                lVar1 = lVar49 + local_68;
                lVar2 = lVar49 + local_70;
                lVar3 = lVar49 + local_78;
                lVar49 = lVar49 + local_58;
                uVar35 = uVar29 & 0xfffffff8;
              }
              if ((int)uVar35 < (int)uVar29) {
                lVar50 = 0;
                do {
                  *(undefined4 *)((long)pvVar9 + lVar50 * 4 + lVar30) = *(undefined4 *)*pauVar27;
                  *(undefined4 *)((long)pvVar9 + lVar50 * 4 + lVar37) =
                       *(undefined4 *)(*pauVar27 + 4);
                  *(undefined4 *)((long)pvVar9 + lVar50 * 4 + lVar4) =
                       *(undefined4 *)(*pauVar27 + 8);
                  *(undefined4 *)((long)pvVar9 + lVar50 * 4 + lVar41) =
                       *(undefined4 *)(*pauVar27 + 0xc);
                  *(undefined4 *)((long)pvVar9 + lVar50 * 4 + lVar1) =
                       *(undefined4 *)(*pauVar27 + 0x10);
                  *(undefined4 *)((long)pvVar9 + lVar50 * 4 + lVar2) =
                       *(undefined4 *)(*pauVar27 + 0x14);
                  *(undefined4 *)((long)pvVar9 + lVar50 * 4 + lVar3) =
                       *(undefined4 *)(*pauVar27 + 0x18);
                  *(undefined4 *)((long)pvVar9 + lVar50 * 4 + lVar49) =
                       *(undefined4 *)(*pauVar27 + 0x1c);
                  pauVar27 = pauVar27 + 1;
                  lVar50 = lVar50 + 1;
                } while (uVar29 - uVar35 != (int)lVar50);
              }
              uVar51 = uVar51 + 1;
              iVar43 = iVar43 + uVar29 * 8;
              lVar45 = lVar45 + lVar26;
              lVar44 = lVar44 + lVar26;
              lVar36 = lVar36 + lVar26;
              local_68 = local_68 + lVar26;
              local_70 = local_70 + lVar26;
              local_78 = local_78 + lVar26;
              local_58 = local_58 + lVar26;
            } while (uVar51 != uVar38);
          }
        }
        iVar43 = 0;
        if (iVar39 - 3U < 2) {
          if (iVar25 == 4) {
            if (0 < (int)uVar5) {
              uVar51 = 1;
              if (1 < (int)uVar5) {
                uVar51 = uVar40;
              }
              lVar36 = (long)(int)uVar47;
              lVar32 = lVar36 * 4;
              lVar44 = lVar36 * 0xc;
              lVar45 = lVar36 * 0x10;
              lVar33 = lVar36 * 8;
              iVar39 = 0;
              uVar34 = 0;
              do {
                sVar46 = bottom_blob->cstep;
                pvVar8 = bottom_blob->data;
                sVar10 = bottom_blob->elemsize;
                puVar54 = (undefined4 *)(sVar46 * uVar34 * sVar10 + (long)pvVar8);
                pvVar9 = top_blob->data;
                if ((int)uVar47 < 4) {
                  lVar26 = (long)(int)(uVar47 * 4 * (int)uVar34) * 4;
                  lVar30 = (uVar34 * 4 + 1) * lVar36 * 4;
                  lVar37 = (uVar34 * 4 + 2) * lVar36 * 4;
                  lVar4 = (uVar34 * 4 + 3) * lVar36 * 4;
                  uVar29 = 0;
                }
                else {
                  iVar43 = 3;
                  lVar26 = 0;
                  do {
                    puVar55 = puVar54;
                    puVar54 = (undefined4 *)
                              ((long)pvVar8 + lVar26 * 4 + 0x40 + sVar46 * sVar10 * uVar34);
                    auVar20 = vunpcklps_avx(*(undefined1 (*) [16])(puVar54 + -0x10),
                                            *(undefined1 (*) [16])(puVar54 + -0xc));
                    auVar21 = vunpcklps_avx(*(undefined1 (*) [16])(puVar54 + -8),
                                            *(undefined1 (*) [16])(puVar54 + -4));
                    auVar12 = vunpckhps_avx(*(undefined1 (*) [16])(puVar54 + -0x10),
                                            *(undefined1 (*) [16])(puVar54 + -0xc));
                    auVar13 = vunpckhps_avx(*(undefined1 (*) [16])(puVar54 + -8),
                                            *(undefined1 (*) [16])(puVar54 + -4));
                    auVar11 = vmovlhps_avx(auVar20,auVar21);
                    auVar21 = vunpckhpd_avx(auVar20,auVar21);
                    auVar20 = vmovlhps_avx(auVar12,auVar13);
                    auVar12 = vunpckhpd_avx(auVar12,auVar13);
                    *(undefined1 (*) [16])((long)pvVar9 + lVar26 + (long)iVar39 * 4) = auVar11;
                    *(undefined1 (*) [16])((long)pvVar9 + lVar26 + lVar32) = auVar21;
                    *(undefined1 (*) [16])((long)pvVar9 + lVar26 + lVar33) = auVar20;
                    *(undefined1 (*) [16])((long)pvVar9 + lVar26 + lVar44) = auVar12;
                    iVar43 = iVar43 + 4;
                    lVar26 = lVar26 + 0x10;
                  } while (iVar43 < (int)uVar47);
                  puVar54 = puVar55 + 0x10;
                  lVar4 = lVar26 + lVar44;
                  lVar37 = lVar26 + lVar33;
                  lVar30 = lVar26 + lVar32;
                  lVar26 = lVar26 + (long)iVar39 * 4;
                  uVar29 = uVar47 & 0xfffffffc;
                }
                if (uVar47 - uVar29 != 0 && (int)uVar29 <= (int)uVar47) {
                  lVar41 = 0;
                  do {
                    *(undefined4 *)((long)pvVar9 + lVar41 * 4 + lVar26) = *puVar54;
                    *(undefined4 *)((long)pvVar9 + lVar41 * 4 + lVar30) = puVar54[1];
                    *(undefined4 *)((long)pvVar9 + lVar41 * 4 + lVar37) = puVar54[2];
                    *(undefined4 *)((long)pvVar9 + lVar41 * 4 + lVar4) = puVar54[3];
                    puVar54 = puVar54 + 4;
                    lVar41 = lVar41 + 1;
                  } while (uVar47 - uVar29 != (int)lVar41);
                }
                uVar34 = uVar34 + 1;
                lVar44 = lVar44 + lVar45;
                lVar33 = lVar33 + lVar45;
                lVar32 = lVar32 + lVar45;
                iVar39 = iVar39 + uVar47 * 4;
              } while (uVar34 != uVar51);
            }
          }
          else if ((iVar25 == 8) && (0 < (int)uVar5)) {
            lVar30 = (long)(int)uVar47;
            lVar45 = lVar30 * 0x1c;
            lVar26 = lVar30 * 0x20;
            lVar32 = lVar30 * 8;
            lVar44 = lVar30 * 0x18;
            lVar33 = lVar30 * 4;
            lVar36 = lVar30 * 0x14;
            local_70 = lVar30 << 4;
            local_78 = lVar30 * 0xc;
            iVar39 = 0;
            uVar51 = 0;
            do {
              sVar46 = bottom_blob->cstep;
              pvVar8 = bottom_blob->data;
              sVar10 = bottom_blob->elemsize;
              pauVar27 = (undefined1 (*) [32])(sVar46 * uVar51 * sVar10 + (long)pvVar8);
              pvVar9 = top_blob->data;
              if ((int)uVar47 < 8) {
                lVar37 = (long)(int)(uVar47 * 8 * (int)uVar51) * 4;
                lVar4 = (uVar51 * 8 + 1) * lVar30 * 4;
                lVar41 = (uVar51 * 8 + 2) * lVar30 * 4;
                lVar1 = (uVar51 * 8 + 3) * lVar30 * 4;
                lVar2 = (uVar51 * 8 + 4) * lVar30 * 4;
                lVar3 = (uVar51 * 8 + 5) * lVar30 * 4;
                lVar49 = (uVar51 * 8 + 6) * lVar30 * 4;
                lVar50 = (uVar51 * 8 + 7) * lVar30 * 4;
                uVar29 = 0;
              }
              else {
                iVar43 = 7;
                lVar37 = 0;
                do {
                  pauVar42 = pauVar27;
                  pauVar27 = (undefined1 (*) [32])
                             ((long)pvVar8 + lVar37 * 8 + sVar46 * sVar10 * uVar51);
                  auVar22 = vunpcklps_avx(*pauVar27,pauVar27[1]);
                  auVar14 = vunpckhps_avx(*pauVar27,pauVar27[1]);
                  auVar23 = vunpcklps_avx(pauVar27[2],pauVar27[3]);
                  auVar15 = vunpckhps_avx(pauVar27[2],pauVar27[3]);
                  auVar24 = vunpcklps_avx(pauVar27[4],pauVar27[5]);
                  auVar16 = vunpckhps_avx(pauVar27[4],pauVar27[5]);
                  auVar56 = vunpcklps_avx(pauVar27[6],pauVar27[7]);
                  auVar17 = vunpckhps_avx(pauVar27[6],pauVar27[7]);
                  auVar18 = vunpcklpd_avx(auVar22,auVar23);
                  auVar22 = vunpckhpd_avx(auVar22,auVar23);
                  auVar23 = vunpcklpd_avx(auVar14,auVar15);
                  auVar14 = vunpckhpd_avx(auVar14,auVar15);
                  auVar19 = vunpcklpd_avx(auVar24,auVar56);
                  auVar15 = vunpckhpd_avx(auVar24,auVar56);
                  auVar24 = vunpcklpd_avx(auVar16,auVar17);
                  auVar16 = vunpckhpd_avx(auVar16,auVar17);
                  auVar57._16_16_ = auVar19._0_16_;
                  auVar57._0_16_ = auVar18._0_16_;
                  auVar59._16_16_ = auVar15._0_16_;
                  auVar59._0_16_ = auVar22._0_16_;
                  auVar61._16_16_ = auVar24._0_16_;
                  auVar61._0_16_ = auVar23._0_16_;
                  auVar63._16_16_ = auVar16._0_16_;
                  auVar63._0_16_ = auVar14._0_16_;
                  auVar17 = vperm2f128_avx(auVar18,auVar19,0x31);
                  auVar22 = vperm2f128_avx(auVar22,auVar15,0x31);
                  auVar15 = vperm2f128_avx(auVar23,auVar24,0x31);
                  auVar14 = vperm2f128_avx(auVar14,auVar16,0x31);
                  *(undefined1 (*) [32])((long)pvVar9 + lVar37 + (long)iVar39 * 4) = auVar57;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar37 + lVar33) = auVar59;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar37 + lVar32) = auVar61;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar37 + local_78) = auVar63;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar37 + local_70) = auVar17;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar37 + lVar36) = auVar22;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar37 + lVar44) = auVar15;
                  *(undefined1 (*) [32])((long)pvVar9 + lVar37 + lVar45) = auVar14;
                  iVar43 = iVar43 + 8;
                  lVar37 = lVar37 + 0x20;
                  pauVar27 = pauVar27 + 8;
                } while (iVar43 < (int)uVar47);
                pauVar27 = pauVar42 + 8;
                lVar50 = lVar37 + lVar45;
                lVar49 = lVar37 + lVar44;
                lVar3 = lVar37 + lVar36;
                lVar2 = lVar37 + local_70;
                lVar1 = lVar37 + local_78;
                lVar41 = lVar37 + lVar32;
                lVar4 = lVar37 + lVar33;
                lVar37 = lVar37 + (long)iVar39 * 4;
                uVar29 = uVar47 & 0xfffffff8;
              }
              if (uVar47 - uVar29 != 0 && (int)uVar29 <= (int)uVar47) {
                lVar31 = 0;
                do {
                  *(undefined4 *)((long)pvVar9 + lVar31 * 4 + lVar37) = *(undefined4 *)*pauVar27;
                  *(undefined4 *)((long)pvVar9 + lVar31 * 4 + lVar4) =
                       *(undefined4 *)(*pauVar27 + 4);
                  *(undefined4 *)((long)pvVar9 + lVar31 * 4 + lVar41) =
                       *(undefined4 *)(*pauVar27 + 8);
                  *(undefined4 *)((long)pvVar9 + lVar31 * 4 + lVar1) =
                       *(undefined4 *)(*pauVar27 + 0xc);
                  *(undefined4 *)((long)pvVar9 + lVar31 * 4 + lVar2) =
                       *(undefined4 *)(*pauVar27 + 0x10);
                  *(undefined4 *)((long)pvVar9 + lVar31 * 4 + lVar3) =
                       *(undefined4 *)(*pauVar27 + 0x14);
                  *(undefined4 *)((long)pvVar9 + lVar31 * 4 + lVar49) =
                       *(undefined4 *)(*pauVar27 + 0x18);
                  *(undefined4 *)((long)pvVar9 + lVar31 * 4 + lVar50) =
                       *(undefined4 *)(*pauVar27 + 0x1c);
                  pauVar27 = pauVar27 + 1;
                  lVar31 = lVar31 + 1;
                } while (uVar47 - uVar29 != (int)lVar31);
              }
              uVar51 = uVar51 + 1;
              lVar45 = lVar45 + lVar26;
              lVar44 = lVar44 + lVar26;
              lVar36 = lVar36 + lVar26;
              local_70 = local_70 + lVar26;
              local_78 = local_78 + lVar26;
              lVar32 = lVar32 + lVar26;
              lVar33 = lVar33 + lVar26;
              iVar39 = iVar39 + uVar47 * 8;
            } while (uVar51 != uVar40);
          }
          iVar43 = 0;
          if (0 < (int)uVar5 && iVar25 == 1) {
            uVar51 = 0;
            iVar43 = 0;
            do {
              pauVar27 = (undefined1 (*) [32])
                         (bottom_blob->cstep * uVar51 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar42 = (undefined1 (*) [32])
                         (uVar51 * (long)(int)uVar47 * 4 + (long)top_blob->data);
              if ((int)uVar47 < 8) {
                uVar29 = 0;
              }
              else {
                iVar25 = 7;
                do {
                  *pauVar42 = *pauVar27;
                  pauVar27 = pauVar27 + 1;
                  pauVar42 = pauVar42 + 1;
                  iVar25 = iVar25 + 8;
                  uVar29 = uVar47 & 0xfffffff8;
                } while (iVar25 < (int)uVar47);
              }
              if (uVar47 - uVar29 != 0 && (int)uVar29 <= (int)uVar47) {
                lVar32 = 0;
                do {
                  *(undefined4 *)(*pauVar42 + lVar32 * 4) = *(undefined4 *)(*pauVar27 + lVar32 * 4);
                  lVar32 = lVar32 + 1;
                } while (uVar47 - uVar29 != (int)lVar32);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar40);
          }
        }
      }
    }
  }
  return iVar43;
}

Assistant:

int Flatten_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = total % 16 == 0 ? 16 : total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 16;
                float* outptr1 = (float*)top_blob + w * (i * 16 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 16 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 16 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 16 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 16 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 16 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 16 + 7);
                float* outptr8 = (float*)top_blob + w * (i * 16 + 8);
                float* outptr9 = (float*)top_blob + w * (i * 16 + 9);
                float* outptra = (float*)top_blob + w * (i * 16 + 10);
                float* outptrb = (float*)top_blob + w * (i * 16 + 11);
                float* outptrc = (float*)top_blob + w * (i * 16 + 12);
                float* outptrd = (float*)top_blob + w * (i * 16 + 13);
                float* outptre = (float*)top_blob + w * (i * 16 + 14);
                float* outptrf = (float*)top_blob + w * (i * 16 + 15);

                int j = 0;
                for (; j + 15 < w; j += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 16;
                float* outptr1 = (float*)top_blob + size * (q * 16 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 16 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 16 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 16 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 16 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 16 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 16 + 7);
                float* outptr8 = (float*)top_blob + size * (q * 16 + 8);
                float* outptr9 = (float*)top_blob + size * (q * 16 + 9);
                float* outptra = (float*)top_blob + size * (q * 16 + 10);
                float* outptrb = (float*)top_blob + size * (q * 16 + 11);
                float* outptrc = (float*)top_blob + size * (q * 16 + 12);
                float* outptrd = (float*)top_blob + size * (q * 16 + 13);
                float* outptre = (float*)top_blob + size * (q * 16 + 14);
                float* outptrf = (float*)top_blob + size * (q * 16 + 15);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}